

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O3

bool __thiscall
gl3cts::ClipDistance::CoverageTest::EnableDisableTest(CoverageTest *this,Functions *gl)

{
  ostringstream *poVar1;
  int iVar2;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  if (0 < this->m_gl_max_clip_distances_value) {
    iVar2 = 0;
    do {
      (*gl->enable)(iVar2 + 0x3000);
      local_1b8.m_value = (*gl->getError)();
      if (local_1b8.m_value != 0) {
        local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1a8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"glEnable(GL_CLIP_DISTANCE",0x19);
        std::ostream::operator<<(poVar1,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,") returned error code ",0x16);
        local_1b8.m_getName = glu::getErrorName;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," instead of GL_NO_ERROR.",0x18);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00a78bf6;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->m_gl_max_clip_distances_value);
    if (0 < this->m_gl_max_clip_distances_value) {
      iVar2 = 0;
      do {
        (*gl->disable)(iVar2 + 0x3000);
        local_1b8.m_value = (*gl->getError)();
        if (local_1b8.m_value != 0) {
          local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1a8 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"glDisable(GL_CLIP_DISTANCE",0x1a);
          std::ostream::operator<<(poVar1,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") returned error code ",0x16);
          local_1b8.m_getName = glu::getErrorName;
          tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," instead of GL_NO_ERROR.",0x18);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00a78bf6:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
          std::ios_base::~ios_base(local_130);
          return false;
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 < this->m_gl_max_clip_distances_value);
    }
  }
  return true;
}

Assistant:

bool gl3cts::ClipDistance::CoverageTest::EnableDisableTest(const glw::Functions& gl)
{
	/*  Check that calling Enable and Disable with GL_CLIP_DISTANCEi for all
	 available clip distances does not generate errors.
	 glw::GLint error_code = GL_NO_ERROR; */

	glw::GLint error_code = GL_NO_ERROR;

	/* Test glEnable */
	for (glw::GLint i = 0; i < m_gl_max_clip_distances_value; ++i)
	{
		gl.enable(GL_CLIP_DISTANCE0 + i);

		error_code = gl.getError();

		if (error_code != GL_NO_ERROR)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glEnable(GL_CLIP_DISTANCE" << i << ") returned error code "
							   << glu::getErrorStr(error_code) << " instead of GL_NO_ERROR."
							   << tcu::TestLog::EndMessage;

			return false;
		}
	}

	/* Test glDisable */
	for (glw::GLint i = 0; i < m_gl_max_clip_distances_value; ++i)
	{
		gl.disable(GL_CLIP_DISTANCE0 + i);

		error_code = gl.getError();

		if (error_code != GL_NO_ERROR)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glDisable(GL_CLIP_DISTANCE" << i << ") returned error code "
							   << glu::getErrorStr(error_code) << " instead of GL_NO_ERROR."
							   << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}